

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

void __thiscall
despot::util::tinyxml::TiXmlDeclaration::TiXmlDeclaration
          (TiXmlDeclaration *this,char *_version,char *_encoding,char *_standalone)

{
  char *_standalone_local;
  char *_encoding_local;
  char *_version_local;
  TiXmlDeclaration *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,DECLARATION);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase =
       (_func_int **)&PTR__TiXmlDeclaration_0026f5d0;
  TiXmlString::TiXmlString(&this->version);
  TiXmlString::TiXmlString(&this->encoding);
  TiXmlString::TiXmlString(&this->standalone);
  TiXmlString::operator=(&this->version,_version);
  TiXmlString::operator=(&this->encoding,_encoding);
  TiXmlString::operator=(&this->standalone,_standalone);
  return;
}

Assistant:

TiXmlDeclaration::TiXmlDeclaration(const char * _version,
	const char * _encoding, const char * _standalone) :
	TiXmlNode(TiXmlNode::DECLARATION) {
	version = _version;
	encoding = _encoding;
	standalone = _standalone;
}